

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall
File::writeAttributeMap
          (File *this,
          map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
          *value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  undefined1 uVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  size_t sVar6;
  ByteString *pBVar7;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *p_Var8;
  unsigned_long uVar9;
  bool bVar10;
  ByteString val;
  OSAttribute attr;
  ByteString local_100;
  long local_d8;
  OSAttribute local_d0;
  
  if (this->valid == true) {
    p_Var5 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(value->_M_t)._M_impl.super__Rb_tree_header;
    bVar10 = (_Rb_tree_header *)p_Var5 == p_Var1;
    if (bVar10) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        OSAttribute::OSAttribute(&local_d0,(OSAttribute *)&p_Var5[1]._M_parent);
        bVar2 = OSAttribute::isBooleanAttribute(&local_d0);
        if (bVar2) {
          uVar9 = uVar9 + 0x11;
LAB_00166528:
          bVar2 = true;
        }
        else {
          bVar2 = OSAttribute::isUnsignedLongAttribute(&local_d0);
          if (bVar2) {
            uVar9 = uVar9 + 0x18;
            goto LAB_00166528;
          }
          bVar2 = OSAttribute::isByteStringAttribute(&local_d0);
          if (bVar2) {
            pBVar7 = OSAttribute::getByteStringValue(&local_d0);
            ByteString::ByteString(&local_100,pBVar7);
            sVar4 = ByteString::size(&local_100);
            uVar9 = uVar9 + sVar4 + 0x18;
            local_100._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_100.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            goto LAB_00166528;
          }
          bVar2 = OSAttribute::isMechanismTypeSetAttribute(&local_d0);
          if (bVar2) {
            p_Var8 = &OSAttribute::getMechanismTypeSetValue(&local_d0)->_M_t;
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&local_100,p_Var8);
            uVar9 = uVar9 + local_d8 * 8 + 0x18;
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&local_100);
            goto LAB_00166528;
          }
          uVar9 = uVar9 + 0x10;
          bVar2 = false;
        }
        OSAttribute::~OSAttribute(&local_d0);
        if (!bVar2) break;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        bVar10 = (_Rb_tree_header *)p_Var5 == p_Var1;
      } while (!bVar10);
    }
    if ((bVar10) && (bVar10 = writeULong(this,uVar9), bVar10)) {
      p_Var5 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar10 = (_Rb_tree_header *)p_Var5 == p_Var1;
      if (bVar10) {
        return bVar10;
      }
      do {
        OSAttribute::OSAttribute(&local_d0,(OSAttribute *)&p_Var5[1]._M_parent);
        bVar2 = writeULong(this,*(unsigned_long *)(p_Var5 + 1));
        if (!bVar2) goto LAB_0016676e;
        bVar2 = OSAttribute::isBooleanAttribute(&local_d0);
        if (bVar2) {
          bVar2 = writeULong(this,1);
          if ((!bVar2) || (bVar2 = OSAttribute::getBooleanValue(&local_d0), this->valid != true))
          goto LAB_0016676e;
          local_100._vptr_ByteString =
               (_func_int **)CONCAT71(local_100._vptr_ByteString._1_7_,-bVar2);
          sVar6 = fwrite(&local_100,1,1,(FILE *)this->stream);
          if (sVar6 != 1) goto LAB_0016676e;
        }
        else {
          bVar2 = OSAttribute::isUnsignedLongAttribute(&local_d0);
          if (bVar2) {
            bVar2 = writeULong(this,2);
            if (!bVar2) goto LAB_0016676e;
            uVar9 = OSAttribute::getUnsignedLongValue(&local_d0);
            uVar3 = writeULong(this,uVar9);
          }
          else {
            bVar2 = OSAttribute::isByteStringAttribute(&local_d0);
            if (bVar2) {
              bVar2 = writeULong(this,3);
              if (!bVar2) goto LAB_0016676e;
              pBVar7 = OSAttribute::getByteStringValue(&local_d0);
              ByteString::ByteString(&local_100,pBVar7);
              uVar3 = writeByteString(this,&local_100);
              local_100._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
              std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                        (&local_100.byteString.
                          super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            }
            else {
              bVar2 = OSAttribute::isMechanismTypeSetAttribute(&local_d0);
              if (!bVar2) goto LAB_0016672d;
              bVar2 = writeULong(this,5);
              if (!bVar2) goto LAB_0016676e;
              p_Var8 = &OSAttribute::getMechanismTypeSetValue(&local_d0)->_M_t;
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&local_100,p_Var8);
              uVar3 = writeMechanismTypeSet
                                (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                       *)&local_100);
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&local_100);
            }
          }
          if (!(bool)uVar3) {
LAB_0016676e:
            OSAttribute::~OSAttribute(&local_d0);
            return bVar10;
          }
        }
LAB_0016672d:
        OSAttribute::~OSAttribute(&local_d0);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        bVar10 = (_Rb_tree_header *)p_Var5 == p_Var1;
        if (bVar10) {
          return bVar10;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool File::writeAttributeMap(const std::map<CK_ATTRIBUTE_TYPE,OSAttribute>& value)
{
	if (!valid) return false;

	// compute length
	unsigned long len = 0;
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		// count attribute type and kind
		len += 8 + 8;

		if (attr.isBooleanAttribute())
		{
			len += 1;
		}
		else if (attr.isUnsignedLongAttribute())
		{
			len += 8;
		}
		else if (attr.isByteStringAttribute())
		{
			ByteString val = attr.getByteStringValue();
			len += 8 + val.size();
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			len += 8 + val.size() * 8;
		}
		else
		{
			return false;
		}
	}

	// write length
	if (!writeULong(len))
	{
		return false;
	}

	// write each attribute
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		unsigned long attrType = (unsigned long) i->first;
		if (!writeULong(attrType))
		{
			return false;
		}

		if (attr.isBooleanAttribute())
		{
			unsigned long attrKind = akBoolean;
			if (!writeULong(attrKind))
			{
				return false;
			}

			bool val = attr.getBooleanValue();
			if (!writeBool(val))
			{
				return false;
			}
		}
		else if (attr.isUnsignedLongAttribute())
		{
			unsigned long attrKind = akInteger;
			if (!writeULong(attrKind))
			{
				return false;
			}

			unsigned long val = attr.getUnsignedLongValue();
			if (!writeULong(val))
			{
				return false;
			}
		}
		else if (attr.isByteStringAttribute())
		{
			unsigned long attrKind = akBinary;
			if (!writeULong(attrKind))
			{
				return false;
			}

			ByteString val = attr.getByteStringValue();
			if (!writeByteString(val))
			{
				return false;
			}
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			unsigned long attrKind = akMechSet;
			if (!writeULong(attrKind))
			{
				return false;
			}

			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			if (!writeMechanismTypeSet(val))
			{
				return false;
			}
		}
	}

	return true;
}